

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzingParameterSet.cpp
# Opt level: O2

void __thiscall FuzzingParameterSet::print_semi_dynamic_parameters(FuzzingParameterSet *this)

{
  string local_78;
  string local_58;
  string local_38;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Printing pattern-specific fuzzing parameters:",
             (allocator<char> *)&local_58);
  Logger::log_info(&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"num_aggressors: %d",(allocator<char> *)&local_78);
  format_string<int>(&local_38,&local_58,this->num_aggressors);
  Logger::log_data(&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"num_refresh_intervals: %d",(allocator<char> *)&local_78);
  format_string<int>(&local_38,&local_58,this->num_refresh_intervals);
  Logger::log_data(&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"total_acts_pattern: %zu",(allocator<char> *)&local_78);
  format_string<int>(&local_38,&local_58,this->total_acts_pattern);
  Logger::log_data(&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"base_period: %d",(allocator<char> *)&local_78);
  format_string<int>(&local_38,&local_58,this->base_period);
  Logger::log_data(&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"agg_inter_distance: %d",(allocator<char> *)&local_78);
  format_string<int>(&local_38,&local_58,this->agg_inter_distance);
  Logger::log_data(&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"flushing_strategy: %s",&local_11);
  to_string_abi_cxx11_(&local_78,this->flushing_strategy);
  format_string<char_const*>(&local_38,&local_58,local_78._M_dataplus._M_p);
  Logger::log_data(&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"fencing_strategy: %s",&local_11);
  to_string_abi_cxx11_(&local_78,this->fencing_strategy);
  format_string<char_const*>(&local_38,&local_58,local_78._M_dataplus._M_p);
  Logger::log_data(&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void FuzzingParameterSet::print_semi_dynamic_parameters() const {
  Logger::log_info("Printing pattern-specific fuzzing parameters:");
  Logger::log_data(format_string("num_aggressors: %d", num_aggressors));
  Logger::log_data(format_string("num_refresh_intervals: %d", num_refresh_intervals));
  Logger::log_data(format_string("total_acts_pattern: %zu", total_acts_pattern));
  Logger::log_data(format_string("base_period: %d", base_period));
  Logger::log_data(format_string("agg_inter_distance: %d", agg_inter_distance));
  Logger::log_data(format_string("flushing_strategy: %s", to_string(flushing_strategy).c_str()));
  Logger::log_data(format_string("fencing_strategy: %s", to_string(fencing_strategy).c_str()));
}